

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void y_convolve_4tap_32x2_avx2(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar5 [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i *coeffs;
  __m256i *ss;
  
  puVar4 = (undefined8 *)(in_RDI + in_RSI);
  uVar1 = puVar4[1];
  uVar2 = puVar4[2];
  uVar3 = puVar4[3];
  *(undefined8 *)(in_RCX + 0x60) = *puVar4;
  *(undefined8 *)(in_RCX + 0x68) = uVar1;
  *(undefined8 *)(in_RCX + 0x70) = uVar2;
  *(undefined8 *)(in_RCX + 0x78) = uVar3;
  auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])(in_RCX + 0x40),
                           *(undefined1 (*) [32])(in_RCX + 0x60));
  *(undefined1 (*) [32])(in_R8 + 0x20) = auVar5;
  auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(in_RCX + 0x40),
                           *(undefined1 (*) [32])(in_RCX + 0x60));
  *(undefined1 (*) [32])(in_R8 + 0x60) = auVar5;
  puVar4 = (undefined8 *)(in_RDI + in_RSI * 2);
  uVar1 = puVar4[1];
  uVar2 = puVar4[2];
  uVar3 = puVar4[3];
  *(undefined8 *)(in_RCX + 0x40) = *puVar4;
  *(undefined8 *)(in_RCX + 0x48) = uVar1;
  *(undefined8 *)(in_RCX + 0x50) = uVar2;
  *(undefined8 *)(in_RCX + 0x58) = uVar3;
  coeffs = *(__m256i **)(in_RCX + 0x48);
  ss = *(__m256i **)(in_RCX + 0x50);
  auVar5 = vpunpcklbw_avx2(*(undefined1 (*) [32])(in_RCX + 0x60),
                           *(undefined1 (*) [32])(in_RCX + 0x40));
  *(undefined1 (*) [32])(in_R9 + 0x20) = auVar5;
  auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(in_RCX + 0x60),
                           *(undefined1 (*) [32])(in_RCX + 0x40));
  *(undefined1 (*) [32])(in_R9 + 0x60) = auVar5;
  convolve_4tap_avx2(ss,coeffs);
  *in_stack_00000008 = auVar5;
  convolve_4tap_avx2(ss,coeffs);
  in_stack_00000008[1] = auVar5;
  convolve_4tap_avx2(ss,coeffs);
  in_stack_00000008[2] = auVar5;
  convolve_4tap_avx2(ss,coeffs);
  in_stack_00000008[3] = auVar5;
  return;
}

Assistant:

static inline void y_convolve_4tap_32x2_avx2(
    const uint8_t *const src, const ptrdiff_t stride, const __m256i coeffs[2],
    __m256i s_256[4], __m256i ss_256[4], __m256i tt_256[4], __m256i r[4]) {
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 1 * stride));
  ss_256[1] = _mm256_unpacklo_epi8(s_256[2], s_256[3]);
  ss_256[3] = _mm256_unpackhi_epi8(s_256[2], s_256[3]);
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 2 * stride));
  tt_256[1] = _mm256_unpacklo_epi8(s_256[3], s_256[2]);
  tt_256[3] = _mm256_unpackhi_epi8(s_256[3], s_256[2]);
  r[0] = convolve_4tap_avx2(ss_256 + 0, coeffs);
  r[1] = convolve_4tap_avx2(ss_256 + 2, coeffs);
  r[2] = convolve_4tap_avx2(tt_256 + 0, coeffs);
  r[3] = convolve_4tap_avx2(tt_256 + 2, coeffs);
}